

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SmallVector.h
# Opt level: O0

iterator __thiscall
llvm::SmallVectorImpl<void_*>::erase
          (SmallVectorImpl<void_*> *this,const_iterator CS,const_iterator CE)

{
  void *pvVar1;
  size_t sVar2;
  void **ppvVar3;
  iterator I;
  iterator N;
  iterator E;
  iterator S;
  const_iterator CE_local;
  const_iterator CS_local;
  SmallVectorImpl<void_*> *this_local;
  
  if (CS < (this->super_SmallVectorTemplateBase<void_*,_true>).
           super_SmallVectorTemplateCommon<void_*,_void>.super_SmallVectorBase.BeginX) {
    __assert_fail("S >= this->begin() && \"Range to erase is out of bounds.\"",
                  "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/include/llvm/ADT/SmallVector.h"
                  ,0x1d1,
                  "iterator llvm::SmallVectorImpl<void *>::erase(const_iterator, const_iterator) [T = void *]"
                 );
  }
  if (CE < CS) {
    __assert_fail("S <= E && \"Trying to erase invalid range.\"",
                  "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/include/llvm/ADT/SmallVector.h"
                  ,0x1d2,
                  "iterator llvm::SmallVectorImpl<void *>::erase(const_iterator, const_iterator) [T = void *]"
                 );
  }
  pvVar1 = (this->super_SmallVectorTemplateBase<void_*,_true>).
           super_SmallVectorTemplateCommon<void_*,_void>.super_SmallVectorBase.BeginX;
  sVar2 = SmallVectorBase::size((SmallVectorBase *)this);
  if ((const_iterator)((long)pvVar1 + sVar2 * 8) < CE) {
    __assert_fail("E <= this->end() && \"Trying to erase past the end.\"",
                  "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/include/llvm/ADT/SmallVector.h"
                  ,0x1d3,
                  "iterator llvm::SmallVectorImpl<void *>::erase(const_iterator, const_iterator) [T = void *]"
                 );
  }
  pvVar1 = (this->super_SmallVectorTemplateBase<void_*,_true>).
           super_SmallVectorTemplateCommon<void_*,_void>.super_SmallVectorBase.BeginX;
  sVar2 = SmallVectorBase::size((SmallVectorBase *)this);
  ppvVar3 = std::move<void**,void**>(CE,(void **)((long)pvVar1 + sVar2 * 8),CS);
  pvVar1 = (this->super_SmallVectorTemplateBase<void_*,_true>).
           super_SmallVectorTemplateCommon<void_*,_void>.super_SmallVectorBase.BeginX;
  sVar2 = SmallVectorBase::size((SmallVectorBase *)this);
  SmallVectorTemplateBase<void_*,_true>::destroy_range(ppvVar3,(void **)((long)pvVar1 + sVar2 * 8));
  SmallVectorBase::set_size
            ((SmallVectorBase *)this,
             (long)ppvVar3 -
             (long)(this->super_SmallVectorTemplateBase<void_*,_true>).
                   super_SmallVectorTemplateCommon<void_*,_void>.super_SmallVectorBase.BeginX >> 3);
  return CS;
}

Assistant:

iterator erase(const_iterator CS, const_iterator CE) {
    // Just cast away constness because this is a non-const member function.
    iterator S = const_cast<iterator>(CS);
    iterator E = const_cast<iterator>(CE);

    assert(S >= this->begin() && "Range to erase is out of bounds.");
    assert(S <= E && "Trying to erase invalid range.");
    assert(E <= this->end() && "Trying to erase past the end.");

    iterator N = S;
    // Shift all elts down.
    iterator I = std::move(E, this->end(), S);
    // Drop the last elts.
    this->destroy_range(I, this->end());
    this->set_size(I - this->begin());
    return(N);
  }